

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minefield.cpp
# Opt level: O0

bool __thiscall Minefield::isGameWon(Minefield *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  reference this_00;
  byte local_41;
  reference local_30;
  int local_20;
  int local_1c;
  int y;
  int x;
  Minefield *this_local;
  
  _y = this;
  bVar2 = isGameEnded(this);
  if (bVar2) {
    for (local_1c = 0; iVar1 = local_1c, iVar3 = getXDimension(this), iVar1 < iVar3;
        local_1c = local_1c + 1) {
      for (local_20 = 0; iVar1 = local_20, iVar3 = getYDimension(this), iVar1 < iVar3;
          local_20 = local_20 + 1) {
        bVar2 = isOpen(this,local_1c,local_20);
        local_41 = 0;
        if (!bVar2) {
          this_00 = std::
                    vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                    ::operator[](&this->mines,(long)local_1c);
          local_30 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(long)local_20);
          bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_30);
          local_41 = bVar2 ^ 0xff;
        }
        if ((local_41 & 1) != 0) {
          return false;
        }
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Minefield::isGameWon() {
    if (! isGameEnded()) {
        return false;
    }

    // all fields w/o mines are opened
    // -> no field opened w/o mine
    for (int x = 0; x < getXDimension(); x++) {
        for (int y = 0; y < getYDimension(); y++) {
            if ((! isOpen(x, y)) && (! mines[x][y])) {
                // field w/o mine has not been opened
                return false;
            }
        }
    }

    // all fields w/o mines are opened
    return true;
}